

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  bool bVar4;
  HeapTypeKind HVar5;
  HeapTypeKind HVar6;
  Struct *pSVar7;
  Struct *pSVar8;
  long lVar9;
  HeapType a_00;
  HeapType b_00;
  ulong uVar10;
  Signature SVar11;
  Signature SVar12;
  HeapType local_60;
  long local_58;
  HeapType local_50;
  long local_48;
  HeapType local_40;
  HeapType a_local;
  HeapType b_local;
  
  local_40.id = a.id;
  a_local = b;
  bVar3 = HeapType::isOpen(&local_40);
  bVar4 = HeapType::isOpen(&a_local);
  if (bVar3 == bVar4) {
    bVar3 = HeapType::isShared(&local_40);
    bVar4 = HeapType::isShared(&a_local);
    if (bVar3 == bVar4) {
      HVar5 = HeapType::getKind(&local_40);
      HVar6 = HeapType::getKind(&a_local);
      if (HVar5 == HVar6) {
        switch(HVar5) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x240);
        case Func:
          SVar11 = HeapType::getSignature(&local_40);
          a_00.id = (uintptr_t)SVar11.results.id;
          SVar12 = HeapType::getSignature(&a_local);
          b_00.id = (uintptr_t)SVar12.results.id;
          bVar3 = shapeEq(SVar11.params.id,SVar12.params.id);
          if (bVar3) {
LAB_00b91ce4:
            bVar3 = shapeEq((Type)a_00.id,(Type)b_00.id);
            return bVar3;
          }
          break;
        case Struct:
          pSVar7 = HeapType::getStruct(&local_40);
          pSVar8 = HeapType::getStruct(&a_local);
          if ((long)(pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
              (long)(pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar8->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            uVar10 = 0xffffffffffffffff;
            lVar9 = 8;
            while( true ) {
              pFVar1 = (pSVar7->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar10 = uVar10 + 1;
              bVar3 = (ulong)((long)(pSVar7->fields).
                                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4)
                      <= uVar10;
              if (bVar3) {
                return bVar3;
              }
              pFVar2 = (pSVar8->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pFVar1->type).id + lVar9) !=
                  *(long *)((long)&(pFVar2->type).id + lVar9)) break;
              bVar4 = shapeEq((Type)*(uintptr_t *)((long)pFVar1 + lVar9 + -8),
                              (Type)*(uintptr_t *)((long)pFVar2 + lVar9 + -8));
              lVar9 = lVar9 + 0x10;
              if (!bVar4) {
                return bVar3;
              }
            }
            return bVar3;
          }
          break;
        case Array:
          HeapType::getArray(&local_60);
          HeapType::getArray(&local_50);
          b_00.id = local_50.id;
          a_00.id = local_60.id;
          if (local_58 == local_48) goto LAB_00b91ce4;
          break;
        case Cont:
          handle_unreachable("TODO: cont",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                             ,0x23e);
        }
      }
    }
  }
  return false;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isOpen() != b.isOpen()) {
    return false;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  auto aKind = a.getKind();
  auto bKind = b.getKind();
  if (aKind != bKind) {
    return false;
  }
  switch (aKind) {
    case HeapTypeKind::Func:
      return shapeEq(a.getSignature(), b.getSignature());
    case HeapTypeKind::Struct:
      return shapeEq(a.getStruct(), b.getStruct());
    case HeapTypeKind::Array:
      return shapeEq(a.getArray(), b.getArray());
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      WASM_UNREACHABLE("unexpected kind");
  }
  return false;
}